

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int __thiscall cmCTest::GenerateNotesFile(cmCTest *this,VectorOfStrings *files)

{
  bool bVar1;
  ostream *poVar2;
  char *local_3f8 [4];
  cmXMLWriter xml;
  cmGeneratedFileStream ofs;
  
  cmGeneratedFileStream::cmGeneratedFileStream(&ofs);
  std::__cxx11::string::string((string *)&xml,"Notes.xml",(allocator *)local_3f8);
  bVar1 = OpenOutputFile(this,&this->CurrentTag,(string *)&xml,&ofs,false);
  std::__cxx11::string::~string((string *)&xml);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&xml);
    poVar2 = std::operator<<((ostream *)&xml,"Cannot open notes file");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::stringbuf::str();
    Log(this,6,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
        ,0x69b,local_3f8[0],false);
    std::__cxx11::string::~string((string *)local_3f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xml);
  }
  else {
    cmXMLWriter::cmXMLWriter(&xml,(ostream *)&ofs,0);
    GenerateCTestNotesOutput(this,&xml,files);
    cmXMLWriter::~cmXMLWriter(&xml);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&ofs);
  return (uint)!bVar1;
}

Assistant:

int cmCTest::GenerateNotesFile(const VectorOfStrings &files)
{
  cmGeneratedFileStream ofs;
  if ( !this->OpenOutputFile(this->CurrentTag, "Notes.xml", ofs) )
    {
    cmCTestLog(this, ERROR_MESSAGE, "Cannot open notes file" << std::endl);
    return 1;
    }
  cmXMLWriter xml(ofs);
  this->GenerateCTestNotesOutput(xml, files);
  return 0;
}